

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O1

int __thiscall
ON_UserStringList::SetUserStrings(ON_UserStringList *this,int count,ON_UserString *us,bool bReplace)

{
  ON_ClassArray<ON_UserString> *this_00;
  ON_UserString *pOVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ON__UINT32 OVar6;
  size_t nel;
  ON_2dex *base;
  ON_2dex *pOVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ON_UserString *pOVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int local_8c;
  ulong local_88;
  int local_6c;
  
  local_8c = 0;
  if (us != (ON_UserString *)0x0 && 0 < count) {
    if (count == 1) {
      bVar2 = ON_wString::IsEmpty(&us->m_key);
      local_8c = 0;
      if ((!bVar2) && (0 < (this->m_e).m_count)) {
        lVar11 = 0;
        lVar17 = 0;
        do {
          iVar4 = ON_wString::CompareOrdinal
                            ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar11),
                             &us->m_key,true);
          if (iVar4 == 0) {
            if (bReplace) {
              bVar2 = ON_wString::IsEmpty(&us->m_string_value);
              if (bVar2) {
                ON_ClassArray<ON_UserString>::Remove(&this->m_e,(int)lVar17);
              }
              else {
                pOVar16 = (this->m_e).m_a;
                ON_wString::operator=
                          ((ON_wString *)((long)&(pOVar16->m_key).m_s + lVar11),&us->m_key);
                ON_wString::operator=
                          ((ON_wString *)((long)&(pOVar16->m_string_value).m_s + lVar11),
                           &us->m_string_value);
              }
              return 1;
            }
            break;
          }
          lVar17 = lVar17 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar17 < (this->m_e).m_count);
        local_8c = 0;
      }
    }
    else {
      iVar4 = (this->m_e).m_count;
      local_88 = (ulong)iVar4;
      uVar5 = iVar4 + count;
      nel = (size_t)(int)uVar5;
      uVar8 = (ulong)(uint)count;
      base = (ON_2dex *)onmalloc((uVar8 + nel) * 8);
      if (0 < (long)local_88) {
        piVar12 = &base->j;
        lVar11 = 0;
        iVar14 = 0;
        do {
          OVar6 = ON_wString::DataCRCLower
                            ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar11),0);
          ((ON_2dex *)(piVar12 + -1))->i = OVar6;
          *piVar12 = iVar14;
          iVar14 = iVar14 + 1;
          piVar12 = piVar12 + 2;
          lVar11 = lVar11 + 0x10;
        } while (local_88 << 4 != lVar11);
      }
      if (0 < count) {
        piVar12 = &base[local_88].j;
        uVar18 = 0;
        pOVar16 = us;
        do {
          OVar6 = ON_wString::DataCRCLower(&pOVar16->m_key,0);
          base[nel + uVar18].i = OVar6;
          base[nel + uVar18].j = (int)uVar18;
          ((ON_2dex *)(piVar12 + -1))->i = OVar6;
          *piVar12 = iVar4;
          uVar18 = uVar18 + 1;
          iVar4 = iVar4 + 1;
          piVar12 = piVar12 + 2;
          pOVar16 = pOVar16 + 1;
        } while (uVar8 != uVar18);
      }
      this_00 = &this->m_e;
      ON_qsort(base,nel,8,cmp_hash_2dex_ij);
      if ((uint)(this->m_e).m_capacity < uVar5) {
        ON_ClassArray<ON_UserString>::SetCapacity(this_00,nel);
      }
      if (count < 1) {
        local_8c = 0;
        local_6c = 0;
      }
      else {
        uVar18 = 0;
        local_6c = 0;
        local_8c = 0;
        do {
          pOVar16 = us + uVar18;
          bVar2 = ON_wString::IsEmpty(&pOVar16->m_key);
          if (!bVar2) {
            pOVar7 = ON_BinarySearch2dexArray(base[nel + uVar18].i,base,nel);
            if (pOVar7 == (ON_2dex *)0x0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_userdata.cpp"
                         ,0x3cd,"","There is a bug in this function.");
            }
            else {
              uVar19 = (long)pOVar7 - (long)base >> 3;
              if (pOVar7 != base) {
                do {
                  if (pOVar7[-1].i != pOVar7->i) goto LAB_0066f634;
                  pOVar7 = pOVar7 + -1;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
                uVar19 = 0;
              }
LAB_0066f634:
              iVar4 = (int)local_88;
              uVar15 = uVar19 + 1;
              uVar10 = uVar19;
              uVar9 = uVar15;
              if (uVar15 < nel) {
                uVar9 = nel;
              }
              do {
                uVar13 = uVar9;
                if ((nel <= uVar15) || (uVar13 = uVar10 + 1, base[uVar15].i != base[uVar19].i))
                break;
                pOVar7 = base + uVar15;
                uVar10 = uVar10 + 1;
                uVar13 = uVar15;
                uVar15 = uVar15 + 1;
              } while (pOVar7->j <= iVar4 + (int)uVar18);
              if (base[uVar19].j < iVar4) {
                bVar2 = uVar19 < uVar13;
                uVar15 = uVar19;
                if (bVar2) {
                  do {
                    if ((base[uVar19].j < iVar4) &&
                       (iVar14 = ON_wString::CompareOrdinal
                                           (&(this->m_e).m_a[base[uVar19].j].m_key,&pOVar16->m_key,
                                            true), iVar14 == 0)) {
                      uVar15 = uVar19;
                      if (bReplace) {
                        iVar14 = base[uVar19].j;
                        pOVar1 = (this->m_e).m_a;
                        ON_wString::operator=(&pOVar1[iVar14].m_key,&pOVar16->m_key);
                        ON_wString::operator=
                                  (&pOVar1[iVar14].m_string_value,&pOVar16->m_string_value);
                        local_8c = local_8c + 1;
                        bVar3 = ON_wString::IsEmpty(&pOVar16->m_string_value);
                        local_6c = local_6c + (uint)bVar3;
                      }
                      break;
                    }
                    uVar19 = uVar19 + 1;
                    bVar2 = uVar19 < uVar13;
                    uVar15 = uVar13;
                  } while (uVar19 != uVar13);
                }
                if ((!bVar2) && (bVar2 = ON_wString::IsEmpty(&pOVar16->m_string_value), !bVar2)) {
                  base[uVar15].j = iVar4;
                  local_88 = (ulong)(iVar4 + 1);
                  ON_ClassArray<ON_UserString>::Append(this_00,pOVar16);
                  local_8c = local_8c + 1;
                }
              }
              else {
                bVar2 = ON_wString::IsEmpty(&pOVar16->m_string_value);
                if (!bVar2) {
                  base[uVar19].j = iVar4;
                  local_88 = (ulong)(iVar4 + 1);
                  ON_ClassArray<ON_UserString>::Append(this_00,pOVar16);
                  local_8c = local_8c + 1;
                }
              }
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar8);
      }
      onfree(base);
      lVar11 = (long)(this->m_e).m_count;
      if ((0 < lVar11) && (0 < local_6c)) {
        lVar17 = lVar11 * 0x10 + -8;
        do {
          bVar2 = ON_wString::IsEmpty((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar17)
                                     );
          if (bVar2) {
            ON_ClassArray<ON_UserString>::Remove(this_00,(int)lVar11 + -1);
            local_6c = local_6c + -1;
          }
          if (lVar11 < 2) {
            return local_8c;
          }
          lVar17 = lVar17 + -0x10;
          lVar11 = lVar11 + -1;
        } while (0 < local_6c);
      }
    }
  }
  return local_8c;
}

Assistant:

int ON_UserStringList::SetUserStrings( int count, const ON_UserString* us, bool bReplace )
{
  int added_count = 0;
  int i;

  if ( count <= 0 || 0 == us )
    return 0;

  if ( 1 == count )
  {
    // skip the hash table hoo haa
    if (  us[0].m_key.IsEmpty() )
      return 0;
    for ( i = 0; i < m_e.Count(); i++ )
    {
      if ( m_e[i].m_key.CompareOrdinal(us[0].m_key, true ) )
        continue;
      if ( bReplace )
      {
        if ( us[0].m_string_value.IsEmpty() )
          m_e.Remove(i);
        else
          m_e[i] = us[0];
        added_count++;
      }
      break;
    }
    return added_count;
  }

  size_t k0, k1;
  int count0 = m_e.Count();
  size_t count0_plus_count = (size_t)(count0 + count);
  ON_2dex* hash = (ON_2dex*)onmalloc( (count0_plus_count + count)*sizeof(hash[0]) );
  ON_2dex* hash1 =  hash + (count0_plus_count);
  const ON_2dex* h;
  int deleted_count = 0;

  for ( i = 0; i < count0; i++ )
  {
    hash[i].i = (int)m_e[i].m_key.DataCRCLower(0);
    hash[i].j = i;
  }

  for ( i = 0; i < count; i++ )
  {
    hash1[i].i = (int)us[i].m_key.DataCRCLower(0);
    hash1[i].j = i;
    hash[i+count0].i = hash1[i].i;
    hash[i+count0].j = hash1[i].j+count0;
  }
  ON_qsort(hash,count0_plus_count,sizeof(hash[0]),cmp_hash_2dex_ij);

  m_e.Reserve(count0+count);
  for ( i = 0; i < count; i++)
  {
    if ( us[i].m_key.IsEmpty() )
      continue;

    // Set k0, k1 so that hash[k0]....,hash[k1-1] are 
    // the hash[] entries keys with the same hash code
    // as us[i].m_key.
    h = ON_BinarySearch2dexArray(hash1[i].i,hash,count0_plus_count);
    if ( 0 == h )
    {
      ON_ERROR("There is a bug in this function.");
      continue;
    }
    k0 = h-hash;
    while ( k0 > 0 && h[-1].i == h[0].i )
    {
      // set h = first element in hash[] with this hash code.
      k0--;
      h--;
    }
    for (k1 = k0+1; k1 < count0_plus_count; k1++ )
    {
      if ( hash[k1].i != hash[k0].i )
        break;
      if ( hash[k1].j > i+count0 )
        break;
    }

    if ( hash[k0].j >= count0 )
    {
      // There are no entries in m_e[] with key matching hash,
      // so us[i].m_key is not present in m_e.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
      continue;
    }

    for (/* empty init*/; k0 < k1; k0++ )
    {
      if ( hash[k0].j < count0 )
      {
        if ( m_e[hash[k0].j].m_key.CompareOrdinal(us[i].m_key,true) )
          continue; // different keys with same hash
        if ( bReplace )
        {
          m_e[hash[k0].j] = us[i];
          added_count++;
          if ( us[i].m_string_value.IsEmpty() )
            deleted_count++;
        }
        break;
      }
    }

    if ( k0 >= k1 )
    {
      // hash is unique up to this point, so us[i].m_key is unique, 
      // so we add it if it is valid.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
    }
  }

  onfree(hash);

  // remove deleted items.
  i = m_e.Count();
  while ( i-- > 0 && deleted_count > 0 )
  {
    if ( m_e[i].m_string_value.IsEmpty() )
    {
      m_e.Remove(i);
      deleted_count--;
    }
  }

  return added_count;
}